

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

void hexdump(zip_uint8_t *data,zip_uint16_t len)

{
  ushort local_14;
  zip_uint16_t i;
  zip_uint16_t len_local;
  zip_uint8_t *data_local;
  
  if (len != 0) {
    printf("0x");
    for (local_14 = 0; local_14 < len; local_14 = local_14 + 1) {
      printf("%02x",(ulong)data[local_14]);
    }
  }
  return;
}

Assistant:

static void
hexdump(const zip_uint8_t *data, zip_uint16_t len) {
    zip_uint16_t i;

    if (len <= 0)
	return;

    printf("0x");

    for (i = 0; i < len; i++)
	printf("%02x", data[i]);

    return;
}